

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void replace_defined(c2m_ctx_t c2m_ctx,VARR_token_t *expr_buffer)

{
  pre_ctx *ppVar1;
  size_t ix;
  int iVar2;
  int iVar3;
  size_t sVar4;
  token_t ptVar5;
  token_t ptVar6;
  ulong uVar7;
  macro_t local_80;
  macro_t tab_macro;
  macro macro_struct;
  char *res;
  token_t id;
  token_t t;
  size_t len;
  size_t k;
  size_t j;
  size_t i;
  pre_ctx_t pre_ctx;
  VARR_token_t *expr_buffer_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->pre_ctx;
  for (j = 0; sVar4 = VARR_token_tlength(expr_buffer), j < sVar4; j = j + 1) {
    ptVar5 = VARR_token_tget(expr_buffer,j);
    if (((short)*(undefined4 *)ptVar5 == 0x103) &&
       (iVar2 = strcmp(ptVar5->repr,"defined"), iVar2 == 0)) {
      k = j + 1;
      sVar4 = VARR_token_tlength(expr_buffer);
      if ((k < sVar4) &&
         (ptVar6 = VARR_token_tget(expr_buffer,k), (short)*(undefined4 *)ptVar6 == 0x20)) {
        k = j + 2;
      }
      if (k < sVar4) {
        ptVar6 = VARR_token_tget(expr_buffer,k);
        iVar2 = (int)j;
        if ((short)*(undefined4 *)ptVar6 == 0x103) {
          tab_macro = (macro_t)ptVar6;
          iVar3 = HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)&tab_macro,HTAB_FIND,&local_80);
          macro_struct._24_8_ = "0";
          if (iVar3 != 0) {
            macro_struct._24_8_ = "1";
          }
          ptVar5 = new_token(c2m_ctx,ptVar5->pos,(char *)macro_struct._24_8_,0x100,N_IGNORE);
          VARR_token_tset(expr_buffer,j,ptVar5);
          del_tokens(expr_buffer,iVar2 + 1,(int)k - iVar2);
        }
        else if ((k < sVar4) &&
                (ptVar6 = VARR_token_tget(expr_buffer,k), (short)*(undefined4 *)ptVar6 == 0x28)) {
          uVar7 = k + 1;
          if ((uVar7 < sVar4) &&
             (ptVar6 = VARR_token_tget(expr_buffer,uVar7), (short)*(undefined4 *)ptVar6 == 0x20)) {
            uVar7 = k + 2;
          }
          k = uVar7;
          ix = k;
          if ((k < sVar4) &&
             (ptVar6 = VARR_token_tget(expr_buffer,k), (short)*(undefined4 *)ptVar6 == 0x103)) {
            uVar7 = k + 1;
            if ((uVar7 < sVar4) &&
               (ptVar6 = VARR_token_tget(expr_buffer,uVar7), (short)*(undefined4 *)ptVar6 == 0x20))
            {
              uVar7 = k + 2;
            }
            k = uVar7;
            if ((k < sVar4) &&
               (ptVar6 = VARR_token_tget(expr_buffer,k), (short)*(undefined4 *)ptVar6 == 0x29)) {
              tab_macro = (macro_t)VARR_token_tget(expr_buffer,ix);
              iVar3 = HTAB_macro_t_do(ppVar1->macro_tab,(macro_t)&tab_macro,HTAB_FIND,&local_80);
              macro_struct._24_8_ = "0";
              if (iVar3 != 0) {
                macro_struct._24_8_ = "1";
              }
              ptVar5 = new_token(c2m_ctx,ptVar5->pos,(char *)macro_struct._24_8_,0x100,N_IGNORE);
              VARR_token_tset(expr_buffer,j,ptVar5);
              del_tokens(expr_buffer,iVar2 + 1,(int)k - iVar2);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void replace_defined (c2m_ctx_t c2m_ctx, VARR (token_t) * expr_buffer) {
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  size_t i, j, k, len;
  token_t t, id;
  const char *res;
  struct macro macro_struct;
  macro_t tab_macro;

  for (i = 0; i < VARR_LENGTH (token_t, expr_buffer); i++) {
    /* Change defined ident and defined (ident) */
    t = VARR_GET (token_t, expr_buffer, i);
    if (t->code == T_ID && strcmp (t->repr, "defined") == 0) {
      j = i + 1;
      len = VARR_LENGTH (token_t, expr_buffer);
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len) continue;
      if ((id = VARR_GET (token_t, expr_buffer, j))->code == T_ID) {
        macro_struct.id = id;
        res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
        VARR_SET (token_t, expr_buffer, i,
                  new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
        del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
        continue;
      }
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != '(') continue;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != T_ID) continue;
      k = j;
      j++;
      if (j < len && VARR_GET (token_t, expr_buffer, j)->code == ' ') j++;
      if (j >= len || VARR_GET (token_t, expr_buffer, j)->code != ')') continue;
      macro_struct.id = VARR_GET (token_t, expr_buffer, k);
      res = HTAB_DO (macro_t, macro_tab, &macro_struct, HTAB_FIND, tab_macro) ? "1" : "0";
      VARR_SET (token_t, expr_buffer, i,
                new_token (c2m_ctx, t->pos, res, T_NUMBER, N_IGNORE));  // ???
      del_tokens (expr_buffer, (int) i + 1, (int) (j - i));
    }
  }
}